

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O3

void __thiscall
Fad<Fad<double>>::
Fad<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>>,FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<Fad<double>>,Fad<Fad<double>>>>,Fad<Fad<double>>>>>>,FadExpr<FadBinaryMinus<Fad<Fad<double>>,FadExpr<FadBinaryMul<Fad<Fad<double>>,Fad<Fad<double>>>>>>>>,FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<Fad<double>>,Fad<Fad<double>>>>,FadExpr<FadBinaryAdd<Fad<Fad<double>>,Fad<Fad<double>>>>>>>>
          (Fad<Fad<double>> *this,
          FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<Fad<double>_>,_FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryAdd<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>_>_>
          *fadexpr)

{
  long lVar1;
  uint uVar2;
  ulong *puVar3;
  Fad<double> *this_00;
  ulong uVar4;
  long lVar5;
  long lVar6;
  value_type local_50;
  
  FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<Fad<double>_>,_FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryAdd<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>_>
  ::val((value_type *)(this + 8),&fadexpr->fadexpr_);
  uVar2 = FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<Fad<double>_>,_FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryAdd<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>_>
          ::size(&fadexpr->fadexpr_);
  *(undefined4 *)(this + 0x28) = 0;
  *(undefined8 *)(this + 0x30) = 0;
  if (0 < (int)uVar2) {
    *(uint *)(this + 0x28) = uVar2;
    lVar5 = (ulong)uVar2 * 0x20;
    puVar3 = (ulong *)operator_new__(lVar5 + 8);
    *puVar3 = (ulong)uVar2;
    lVar6 = 0;
    this_00 = (Fad<double> *)(puVar3 + 1);
    do {
      Fad<double>::Fad(this_00);
      lVar6 = lVar6 + -0x20;
      this_00 = this_00 + 1;
    } while (-lVar6 != lVar5);
    *(Fad<double> **)(this + 0x30) = (Fad<double> *)(puVar3 + 1);
  }
  *(undefined8 *)(this + 0x38) = 0;
  *(undefined4 *)(this + 0x40) = 0;
  *(undefined8 *)(this + 0x48) = 0;
  *(undefined8 *)(this + 0x50) = 0;
  uVar2 = FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<Fad<double>_>,_FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryAdd<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>_>
          ::size(&fadexpr->fadexpr_);
  if (0 < (int)uVar2) {
    lVar5 = 0x18;
    uVar4 = 0;
    do {
      FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<Fad<double>_>,_FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryAdd<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>_>
      ::dx(&local_50,&fadexpr->fadexpr_,(int)uVar4);
      lVar1 = *(long *)(this + 0x30);
      lVar6 = lVar1 + lVar5;
      *(double *)(lVar6 + -0x18) = local_50.val_;
      Vector<double>::operator=((Vector<double> *)(lVar6 + -0x10),&local_50.dx_);
      *(double *)(lVar1 + lVar5) = local_50.defaultVal;
      Fad<double>::~Fad(&local_50);
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + 0x20;
    } while (uVar2 != uVar4);
  }
  return;
}

Assistant:

inline Fad(const FadExpr<ExprT>& fadexpr) : 
    val_(fadexpr.val()), 
    dx_(fadexpr.size()), 
    defaultVal(T(0))
    {
      int sz = fadexpr.size();

      if ( sz ) {
        for(int i=0; i<sz; ++i) 
          dx_[i] = fadexpr.dx(i);
      }
    }